

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

Gia_Man_t * Gia_ManMuxRestructure(Gia_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Vec_Bit_t *p_00;
  int *__s;
  Gia_Man_t *p_01;
  size_t sVar8;
  char *pcVar9;
  uint *puVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  uint uVar13;
  int Entry;
  int Entry_00;
  int Entry_01;
  int iVar14;
  Gia_Obj_t *pGVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  
  iVar14 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  p_00 = (Vec_Bit_t *)malloc(0x10);
  p_00->nSize = 0;
  iVar23 = iVar14 * 0x20;
  p_00->nCap = iVar23;
  if (iVar14 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar14 * 4);
  }
  p_00->pArray = __s;
  p_00->nSize = iVar23;
  memset(__s,0,(long)iVar14 << 2);
  if (p->pSibls != (int *)0x0) {
    __assert_fail("!Gia_ManHasChoices(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xee,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("!Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xef,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xf0,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_01->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_01->pSpec = pcVar9;
  puVar10 = (uint *)calloc((long)p_01->nObjsAlloc,4);
  p_01->pMuxes = puVar10;
  p->pObjs->Value = 0;
  Gia_ManHashStart(p_01);
  if (1 < p->nObjs) {
    lVar22 = 1;
    lVar24 = 0x14;
    do {
      pGVar3 = p->pObjs;
      uVar4 = *(ulong *)((long)pGVar3 + lVar24 + -8);
      uVar5 = (uint)uVar4;
      if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
        pGVar11 = Gia_ManAppendObj(p_01);
        uVar4 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar4 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar15 = p_01->pObjs;
        if ((pGVar11 < pGVar15) || (pGVar15 + p_01->nObjs <= pGVar11)) {
LAB_0021e27b:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar15) >> 2) * -0x55555555);
        pGVar15 = p_01->pObjs;
        if ((pGVar11 < pGVar15) || (pGVar15 + p_01->nObjs <= pGVar11)) goto LAB_0021e27b;
        *(int *)(&pGVar3->field_0x0 + lVar24) =
             (int)((ulong)((long)pGVar11 - (long)pGVar15) >> 2) * 0x55555556;
      }
      else {
        iVar14 = (int)(uVar4 & 0x1fffffff);
        if ((uVar4 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar5) {
          uVar16 = uVar5 & 0x1fffffff;
          uVar13 = (uint)(uVar4 >> 0x20);
          uVar17 = uVar13 & 0x1fffffff;
          if ((((int)uVar5 < 0) || (uVar16 == 0x1fffffff)) || (uVar16 != uVar17)) {
            puVar10 = p->pMuxes;
            if (puVar10 != (uint *)0x0) {
              pGVar15 = (Gia_Obj_t *)((long)pGVar3 + lVar24 + -8);
              if (puVar10[lVar22] != 0) {
                if (puVar10 == (uint *)0x0) goto LAB_0021e056;
                if (*(int *)((long)puVar10 + (lVar22 * 4 - (ulong)(uint)(iVar14 * 4))) != 0) {
                  uVar20 = (ulong)-uVar16 + lVar22;
                  uVar18 = (uint)uVar20;
                  if (((int)uVar18 < 0) || (iVar23 <= (int)uVar18)) {
LAB_0021e316:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                  ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
                  }
                  if (((uint)__s[uVar20 >> 5 & 0x7ffffff] >> (uVar18 & 0x1f) & 1) == 0) {
                    if (puVar10 == (uint *)0x0) goto LAB_0021e056;
                    if (*(int *)((long)puVar10 + (lVar22 * 4 - (ulong)((uVar13 & 0x1fffffff) << 2)))
                        != 0) {
                      uVar21 = (ulong)-uVar17 + lVar22;
                      uVar18 = (uint)uVar21;
                      if (((int)uVar18 < 0) || (iVar23 <= (int)uVar18)) goto LAB_0021e316;
                      if (((uint)__s[uVar21 >> 5 & 0x7ffffff] >> (uVar18 & 0x1f) & 1) == 0) {
                        uVar18 = 0xffffffff;
                        if (puVar10 != (uint *)0x0) {
                          uVar19 = puVar10[uVar20 & 0xffffffff];
                          if (uVar19 != 0) {
                            if ((int)uVar19 < 0) goto LAB_0021e335;
                            uVar18 = uVar19 >> 1;
                          }
                        }
                        if (puVar10 == (uint *)0x0) {
                          uVar19 = 0xffffffff;
                        }
                        else {
                          uVar1 = puVar10[uVar21 & 0xffffffff];
                          uVar19 = 0xffffffff;
                          if (uVar1 != 0) {
                            if ((int)uVar1 < 0) {
LAB_0021e335:
                              __assert_fail("Lit >= 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                            ,0x12f,"int Abc_Lit2Var(int)");
                            }
                            uVar19 = uVar1 >> 1;
                          }
                        }
                        if (uVar18 == uVar19) {
                          pGVar11 = (Gia_Obj_t *)
                                    ((long)pGVar15 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3);
                          iVar14 = Gia_ObjFanin2Copy(p,pGVar15);
                          iVar6 = Gia_ObjFanin2Copy(p,pGVar11);
                          iVar7 = Gia_ObjFanin0Copy(pGVar15);
                          iVar14 = Gia_ManHashMux(p_01,iVar14,iVar6,iVar7);
                          iVar6 = Gia_ObjFanin1Copy(pGVar11);
                          iVar7 = Gia_ObjFanin0Copy(pGVar11);
                          iVar6 = Gia_ManHashMux(p_01,iVar14,iVar6,iVar7);
                          iVar7 = Gia_ObjFanin2Copy(p,pGVar15);
                          iVar14 = Gia_ManHashMux(p_01,iVar7,iVar6,iVar14);
                          *(int *)(&pGVar3->field_0x0 + lVar24) = iVar14;
                          iVar14 = (int)lVar22;
                          Vec_BitWriteEntry(p_00,iVar14 - (*(uint *)((long)pGVar3 + lVar24 + -8) &
                                                          0x1fffffff),Entry);
                          Vec_BitWriteEntry(p_00,iVar14 - (*(uint *)((long)pGVar3 + lVar24 + -4) &
                                                          0x1fffffff),Entry_00);
                          Vec_BitWriteEntry(p_00,iVar14,Entry_01);
                          goto LAB_0021e106;
                        }
                      }
                    }
                  }
                }
              }
              if ((puVar10 != (uint *)0x0) && (puVar10[lVar22] != 0)) {
                iVar14 = Gia_ObjFanin2Copy(p,pGVar15);
                uVar4 = *(ulong *)((long)pGVar3 + lVar24 + -8);
                uVar5 = *(uint *)((long)pGVar3 +
                                 (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3 + lVar24);
                if ((int)uVar5 < 0) goto LAB_0021e29a;
                uVar13 = *(uint *)((long)pGVar3 +
                                  lVar24 + (ulong)(((uint)uVar4 & 0x1fffffff) << 2) * -3);
                if ((int)uVar13 < 0) goto LAB_0021e29a;
                iVar14 = Gia_ManHashMux(p_01,iVar14,(uint)(uVar4 >> 0x3d) & 1 ^ uVar5,
                                        uVar13 ^ (uint)uVar4 >> 0x1d & 1);
                goto LAB_0021e102;
              }
            }
LAB_0021e056:
            uVar18 = *(uint *)((long)pGVar3 + lVar24 + (ulong)(uint)(iVar14 * 4) * -3);
            if ((((int)uVar5 < 0) || (iVar14 == 0x1fffffff)) || (uVar17 <= uVar16)) {
              if (((int)uVar18 < 0) ||
                 (uVar5 = *(uint *)((long)pGVar3 + lVar24 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3
                                   ), (int)uVar5 < 0)) goto LAB_0021e29a;
              iVar14 = Gia_ManHashAnd(p_01,uVar18 ^ (uint)(uVar4 >> 0x1d) & 1,
                                      uVar5 ^ uVar13 >> 0x1d & 1);
            }
            else {
              if (((int)uVar18 < 0) ||
                 (uVar5 = *(uint *)((long)pGVar3 + lVar24 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3
                                   ), (int)uVar5 < 0)) {
LAB_0021e29a:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              iVar14 = Gia_ManHashXor(p_01,uVar18 ^ (uint)(uVar4 >> 0x1d) & 1,
                                      uVar5 ^ uVar13 >> 0x1d & 1);
            }
          }
          else {
            uVar13 = *(uint *)((long)pGVar3 + lVar24 + (ulong)(uint)(iVar14 << 2) * -3);
            if ((int)uVar13 < 0) goto LAB_0021e29a;
            iVar14 = Gia_ManAppendBuf(p_01,uVar13 ^ uVar5 >> 0x1d & 1);
          }
        }
        else {
          uVar13 = *(uint *)((long)pGVar3 + lVar24 + (ulong)(uint)(iVar14 << 2) * -3);
          if ((int)uVar13 < 0) goto LAB_0021e29a;
          iVar14 = Gia_ManAppendCo(p_01,uVar13 ^ uVar5 >> 0x1d & 1);
        }
LAB_0021e102:
        *(int *)(&pGVar3->field_0x0 + lVar24) = iVar14;
      }
LAB_0021e106:
      lVar22 = lVar22 + 1;
      lVar24 = lVar24 + 0xc;
    } while (lVar22 < p->nObjs);
  }
  if (__s != (int *)0x0) {
    free(__s);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  Gia_ManHashStop(p_01);
  Gia_ManSetRegNum(p_01,p->nRegs);
  pGVar12 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManMuxRestructure( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Vec_Bit_t * vUsed = Vec_BitStart( Gia_ManObjNum(p) );
    assert( !Gia_ManHasChoices(p) );
    assert( !Gia_ManHasMapping(p) );
    assert( p->pMuxes != NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsMuxId(p, i) && 
                  Gia_ObjIsMuxId(p, Gia_ObjFaninId0(pObj, i)) && !Vec_BitEntry(vUsed, Gia_ObjFaninId0(pObj, i)) && 
                  Gia_ObjIsMuxId(p, Gia_ObjFaninId1(pObj, i)) && !Vec_BitEntry(vUsed, Gia_ObjFaninId1(pObj, i)) &&
                  Gia_ObjFaninId2(p, Gia_ObjFaninId0(pObj, i)) == Gia_ObjFaninId2(p, Gia_ObjFaninId1(pObj, i))  )
        {
            Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
            int Value0 = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin2Copy(p, pFan1), Gia_ObjFanin0Copy(pObj) );
            int Value1 = Gia_ManHashMux( pNew, Value0, Gia_ObjFanin1Copy(pFan1), Gia_ObjFanin0Copy(pFan1) );
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Value1, Value0 );
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId1(pObj, i), 1 );
            Vec_BitWriteEntry( vUsed, i, 1 );
            nNodes++;
        }
        else if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Vec_BitFree( vUsed );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}